

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_compressionParameters cPar,
          unsigned_long_long srcSize,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters ZVar1;
  uint uVar2;
  U32 UVar3;
  uint local_64;
  U32 cycleLog;
  U32 dictAndWindowLog;
  U32 srcLog;
  U32 tSize;
  U64 maxWindowResize;
  U64 minSrcSize;
  size_t sStack_18;
  ZSTD_cParamMode_e mode_local;
  size_t dictSize_local;
  unsigned_long_long srcSize_local;
  
  sStack_18 = dictSize;
  dictSize_local = srcSize;
  switch(mode) {
  case ZSTD_cpm_noAttachDict:
  case ZSTD_cpm_unknown:
    break;
  case ZSTD_cpm_attachDict:
    sStack_18 = 0;
    break;
  case ZSTD_cpm_createCDict:
    if ((dictSize != 0) && (srcSize == 0xffffffffffffffff)) {
      dictSize_local = 0x201;
    }
  }
  if ((dictSize_local < 0x40000000) && (sStack_18 < 0x40000000)) {
    uVar2 = (int)dictSize_local + (int)sStack_18;
    if (uVar2 < 0x40) {
      local_64 = 6;
    }
    else {
      UVar3 = ZSTD_highbit32(uVar2 - 1);
      local_64 = UVar3 + 1;
    }
    if (local_64 < cPar.windowLog) {
      cPar.windowLog = local_64;
    }
  }
  if (dictSize_local != 0xffffffffffffffff) {
    ZSTD_dictAndWindowLog(cPar.windowLog,dictSize_local,sStack_18);
    ZSTD_cycleLog(cPar.chainLog,cPar.strategy);
  }
  if (cPar.windowLog < 10) {
    cPar.windowLog = 10;
  }
  ZVar1 = cPar;
  __return_storage_ptr__->windowLog = cPar.windowLog;
  __return_storage_ptr__->chainLog = cPar.chainLog;
  cPar._8_8_ = ZVar1._8_8_;
  __return_storage_ptr__->hashLog = cPar.hashLog;
  __return_storage_ptr__->searchLog = cPar.searchLog;
  cPar._16_8_ = ZVar1._16_8_;
  __return_storage_ptr__->minMatch = cPar.minMatch;
  __return_storage_ptr__->targetLength = cPar.targetLength;
  cPar.strategy = ZVar1.strategy;
  __return_storage_ptr__->strategy = cPar.strategy;
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize,
                            ZSTD_cParamMode_e mode)
{
    const U64 minSrcSize = 513; /* (1<<9) + 1 */
    const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
        /* If we don't know the source size, don't make any
         * assumptions about it. We will already have selected
         * smaller parameters if a dictionary is in use.
         */
        break;
    case ZSTD_cpm_createCDict:
        /* Assume a small source size when creating a dictionary
         * with an unkown source size.
         */
        if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            srcSize = minSrcSize;
        break;
    case ZSTD_cpm_attachDict:
        /* Dictionary has its own dedicated parameters which have
         * already been selected. We are selecting parameters
         * for only the source.
         */
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize < maxWindowResize)
      && (dictSize < maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (srcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const dictAndWindowLog = ZSTD_dictAndWindowLog(cPar.windowLog, (U64)srcSize, (U64)dictSize);
        U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cPar.hashLog > dictAndWindowLog+1) cPar.hashLog = dictAndWindowLog+1;
        if (cycleLog > dictAndWindowLog)
            cPar.chainLog -= (cycleLog - dictAndWindowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    return cPar;
}